

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

word * Extra_NpnRead(char *pFileName,int nFuncs)

{
  word *pwVar1;
  FILE *__stream;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  word *pwVar5;
  ulong uVar6;
  char pBuffer [100];
  char acStack_98 [104];
  
  uVar3 = (ulong)(uint)nFuncs;
  pwVar1 = (word *)calloc((long)nFuncs,8);
  __stream = fopen(pFileName,"rb");
  pcVar2 = fgets(acStack_98,100,__stream);
  iVar4 = 0;
  pwVar5 = pwVar1;
  while (pcVar2 != (char *)0x0) {
    Extra_ReadHex((uint *)pwVar5,acStack_98 + (ulong)(acStack_98[1] == 'x') * 2,0x10);
    pcVar2 = fgets(acStack_98,100,__stream);
    pwVar5 = pwVar5 + 1;
    iVar4 = iVar4 + 1;
  }
  fclose(__stream);
  if (iVar4 == nFuncs) {
    if (0 < nFuncs) {
      if (9 < nFuncs) {
        uVar3 = 10;
      }
      uVar6 = 0;
      pwVar5 = pwVar1;
      do {
        printf("Line %d : ",uVar6 & 0xffffffff);
        Extra_PrintHex(_stdout,(uint *)pwVar5,6);
        putchar(10);
        uVar6 = uVar6 + 1;
        pwVar5 = pwVar5 + 1;
      } while (uVar3 != uVar6);
    }
    return pwVar1;
  }
  __assert_fail("i == nFuncs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0x976,"word *Extra_NpnRead(char *, int)");
}

Assistant:

word * Extra_NpnRead( char * pFileName, int nFuncs )
{
    FILE * pFile;
    word * pFuncs;
    char pBuffer[100];
    int i = 0;
    pFuncs = ABC_CALLOC( word, nFuncs );
    pFile = fopen( pFileName, "rb" );
    while ( fgets( pBuffer, 100, pFile ) )
        Extra_ReadHex( (unsigned *)(pFuncs + i++), (pBuffer[1] == 'x' ? pBuffer+2 : pBuffer), 16 );
    fclose( pFile );
    assert( i == nFuncs );
    for ( i = 0; i < Abc_MinInt(nFuncs, 10); i++ )
    {
        printf( "Line %d : ", i );
        Extra_PrintHex( stdout, (unsigned *)(pFuncs + i), 6 ), printf( "\n" );
    }
    return pFuncs;
}